

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::uniformui_incompatible_type
               (NegativeTestContext *ctx)

{
  ostringstream *this;
  RenderContext *renderCtx;
  GLint location;
  GLint location_00;
  GLint location_01;
  GLint location_02;
  long lVar1;
  ProgramSources sources;
  ShaderProgram program;
  value_type local_2c0;
  value_type local_2a0;
  undefined1 local_280 [16];
  undefined1 local_270 [104];
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  undefined1 local_1d0 [208];
  ShaderProgram local_100;
  
  renderCtx = ctx->m_renderCtx;
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a0,
             "#version 300 es\nuniform mediump vec4 vec4_v;\nuniform mediump mat4 mat4_v;\nvoid main (void)\n{\n\tgl_Position = mat4_v * vec4_v;\n}\n"
             ,"");
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c0,
             "#version 300 es\nuniform mediump ivec4 ivec4_f;\nuniform mediump uvec4 uvec4_f;\nuniform sampler2D sampler_f;\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor.xy = (vec4(uvec4_f) + vec4(ivec4_f)).xy;\n\tfragColor.zw = texture(sampler_f, vec2(0.0, 0.0)).zw;\n}\n"
             ,"");
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_280,0,0xac);
  local_1d0._0_8_ = (pointer)0x0;
  local_1d0[8] = 0;
  local_1d0._9_7_ = 0;
  local_1d0[0x10] = 0;
  local_1d0._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_280,&local_2a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_270 + 8),&local_2c0);
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_280);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f0);
  lVar1 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_100.m_program.m_program);
  location = glu::CallLogWrapper::glGetUniformLocation
                       (&ctx->super_CallLogWrapper,local_100.m_program.m_program,"vec4_v");
  location_00 = glu::CallLogWrapper::glGetUniformLocation
                          (&ctx->super_CallLogWrapper,local_100.m_program.m_program,"ivec4_f");
  location_01 = glu::CallLogWrapper::glGetUniformLocation
                          (&ctx->super_CallLogWrapper,local_100.m_program.m_program,"uvec4_f");
  location_02 = glu::CallLogWrapper::glGetUniformLocation
                          (&ctx->super_CallLogWrapper,local_100.m_program.m_program,"sampler_f");
  NegativeTestContext::expectError(ctx,0);
  if ((location_01 == -1 || (location_00 == -1 || location == -1)) || location_02 == -1) {
    local_280._0_8_ = (ctx->super_CallLogWrapper).m_log;
    this = (ostringstream *)(local_280 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"// ERROR: Failed to retrieve uniform location",0x2d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::ios_base::~ios_base(local_208);
    local_280._0_8_ = (pointer)local_270;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"Failed to retrieve uniform location","");
    NegativeTestContext::fail(ctx,(string *)local_280);
    if ((pointer)local_280._0_8_ != (pointer)local_270) {
      operator_delete((void *)local_280._0_8_,(ulong)(local_270._0_8_ + 1));
    }
  }
  local_280._0_8_ = (pointer)local_270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_280,
             "GL_INVALID_OPERATION is generated if the size of the uniform variable declared in the shader does not match the size indicated by the ctx.glUniform command."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_280);
  if ((pointer)local_280._0_8_ != (pointer)local_270) {
    operator_delete((void *)local_280._0_8_,(ulong)(local_270._0_8_ + 1));
  }
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_100.m_program.m_program);
  glu::CallLogWrapper::glUniform1ui(&ctx->super_CallLogWrapper,location_01,0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform2ui(&ctx->super_CallLogWrapper,location_01,0,0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform3ui(&ctx->super_CallLogWrapper,location_01,0,0,0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform4ui(&ctx->super_CallLogWrapper,location_01,0,0,0,0);
  NegativeTestContext::expectError(ctx,0);
  NegativeTestContext::endSection(ctx);
  local_280._0_8_ = (pointer)local_270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_280,
             "GL_INVALID_OPERATION is generated if ctx.glUniform{1234}i is used to load a uniform variable of type int, ivec2, ivec3, ivec4, or an array of these."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_280);
  if ((pointer)local_280._0_8_ != (pointer)local_270) {
    operator_delete((void *)local_280._0_8_,(ulong)(local_270._0_8_ + 1));
  }
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_100.m_program.m_program);
  glu::CallLogWrapper::glUniform1ui(&ctx->super_CallLogWrapper,location_00,0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform2ui(&ctx->super_CallLogWrapper,location_00,0,0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform3ui(&ctx->super_CallLogWrapper,location_00,0,0,0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform4ui(&ctx->super_CallLogWrapper,location_00,0,0,0,0);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  local_280._0_8_ = (pointer)local_270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_280,
             "GL_INVALID_OPERATION is generated if ctx.glUniform{1234}i is used to load a uniform variable of type float, vec2, vec3, or vec4."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_280);
  if ((pointer)local_280._0_8_ != (pointer)local_270) {
    operator_delete((void *)local_280._0_8_,(ulong)(local_270._0_8_ + 1));
  }
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_100.m_program.m_program);
  glu::CallLogWrapper::glUniform1ui(&ctx->super_CallLogWrapper,location,0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform2ui(&ctx->super_CallLogWrapper,location,0,0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform3ui(&ctx->super_CallLogWrapper,location,0,0,0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform4ui(&ctx->super_CallLogWrapper,location,0,0,0,0);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  local_280._0_8_ = (pointer)local_270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_280,
             "GL_INVALID_OPERATION is generated if a sampler is loaded using a command other than ctx.glUniform1i and ctx.glUniform1iv."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_280);
  if ((pointer)local_280._0_8_ != (pointer)local_270) {
    operator_delete((void *)local_280._0_8_,(ulong)(local_270._0_8_ + 1));
  }
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_100.m_program.m_program);
  glu::CallLogWrapper::glUniform1ui(&ctx->super_CallLogWrapper,location_02,0);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::ShaderProgram::~ShaderProgram(&local_100);
  return;
}

Assistant:

void uniformui_incompatible_type (NegativeTestContext& ctx)
{
	glu::ShaderProgram program(ctx.getRenderContext(), glu::makeVtxFragSources(uniformTestVertSource, uniformTestFragSource));

	ctx.glUseProgram(program.getProgram());
	GLint vec4_v	= ctx.glGetUniformLocation(program.getProgram(), "vec4_v");	// vec4
	GLint ivec4_f	= ctx.glGetUniformLocation(program.getProgram(), "ivec4_f");	// ivec4
	GLint uvec4_f	= ctx.glGetUniformLocation(program.getProgram(), "uvec4_f");	// uvec4
	GLint sampler_f	= ctx.glGetUniformLocation(program.getProgram(), "sampler_f");	// sampler2D
	ctx.expectError(GL_NO_ERROR);

	if (vec4_v == -1 || ivec4_f == -1 || uvec4_f == -1 || sampler_f == -1)
	{
		ctx.getLog() << TestLog::Message << "// ERROR: Failed to retrieve uniform location" << TestLog::EndMessage;
		ctx.fail("Failed to retrieve uniform location");
	}

	ctx.beginSection("GL_INVALID_OPERATION is generated if the size of the uniform variable declared in the shader does not match the size indicated by the ctx.glUniform command.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniform1ui(uvec4_f, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform2ui(uvec4_f, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform3ui(uvec4_f, 0, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform4ui(uvec4_f, 0, 0, 0, 0);
	ctx.expectError(GL_NO_ERROR);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if ctx.glUniform{1234}i is used to load a uniform variable of type int, ivec2, ivec3, ivec4, or an array of these.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniform1ui(ivec4_f, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform2ui(ivec4_f, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform3ui(ivec4_f, 0, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform4ui(ivec4_f, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if ctx.glUniform{1234}i is used to load a uniform variable of type float, vec2, vec3, or vec4.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniform1ui(vec4_v, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform2ui(vec4_v, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform3ui(vec4_v, 0, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform4ui(vec4_v, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if a sampler is loaded using a command other than ctx.glUniform1i and ctx.glUniform1iv.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniform1ui(sampler_f, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glUseProgram(0);
}